

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
fetch(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
     node_t *parent,
     vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
     *siblings)

{
  size_t *psVar1;
  ulong uVar2;
  char *__s;
  pointer pnVar3;
  pointer pnVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  node_t tmp_node;
  value_type local_50;
  
  sVar9 = 0;
  if (-1 < this->error_) {
    for (sVar7 = parent->left; sVar7 < parent->right; sVar7 = sVar7 + 1) {
      psVar1 = this->length_;
      if (psVar1 == (size_t *)0x0) {
        uVar5 = strlen(this->key_[sVar7]);
      }
      else {
        uVar5 = psVar1[sVar7];
      }
      uVar2 = parent->depth;
      if (uVar2 <= uVar5) {
        __s = this->key_[sVar7];
        if (psVar1 == (size_t *)0x0) {
          uVar5 = strlen(__s);
        }
        else {
          uVar5 = psVar1[sVar7];
        }
        uVar6 = 0;
        if (uVar5 != uVar2) {
          uVar6 = (byte)__s[uVar2] + 1;
        }
        if (uVar6 < (uint)sVar9) {
          this->error_ = -3;
          return 0;
        }
        pnVar3 = (siblings->
                 super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pnVar4 = (siblings->
                 super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pnVar3 == pnVar4 || (uint)sVar9 != uVar6) {
          local_50.depth = uVar2 + 1;
          if (pnVar3 != pnVar4) {
            pnVar4[-1].right = sVar7;
          }
          local_50.code = uVar6;
          local_50.left = sVar7;
          std::
          vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ::push_back(siblings,&local_50);
          sVar9 = (size_t)uVar6;
        }
      }
    }
    pnVar3 = (siblings->
             super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(siblings->
                  super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3;
    if (lVar8 != 0) {
      *(size_t *)((long)pnVar3 + lVar8 + -8) = parent->right;
    }
    sVar9 = lVar8 >> 5;
  }
  return sVar9;
}

Assistant:

size_t fetch(const node_t &parent, std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    array_u_type_ prev = 0;

    for (size_t i = parent.left; i < parent.right; ++i) {
      if ((length_ ? length_[i] : length_func_()(key_[i])) < parent.depth)
        continue;

      const node_u_type_ *tmp = reinterpret_cast<node_u_type_ *>(key_[i]);

      array_u_type_ cur = 0;
      if ((length_ ? length_[i] : length_func_()(key_[i])) != parent.depth)
        cur = (array_u_type_)tmp[parent.depth] + 1;

      if (prev > cur) {
        error_ = -3;
        return 0;
      }

      if (cur != prev || siblings.empty()) {
        node_t tmp_node;
        tmp_node.depth = parent.depth + 1;
        tmp_node.code  = cur;
        tmp_node.left  = i;
        if (!siblings.empty()) siblings[siblings.size()-1].right = i;

        siblings.push_back(tmp_node);
      }

      prev = cur;
    }

    if (!siblings.empty())
      siblings[siblings.size()-1].right = parent.right;

    return siblings.size();
  }